

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::PatternMap::getPatternFromSkeleton
          (PatternMap *this,PtnSkeleton *skeleton,PtnSkeleton **specifiedSkeletonPtr)

{
  char *pcVar1;
  char *pcVar2;
  PtnSkeleton *pPVar3;
  long lVar4;
  UnicodeString *pUVar5;
  ushort uVar6;
  PtnElem *pPVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  if (specifiedSkeletonPtr != (PtnSkeleton **)0x0) {
    *specifiedSkeletonPtr = (PtnSkeleton *)0x0;
  }
  lVar4 = -0x10;
  do {
    if (*(UBool *)((long)(&skeleton->baseOriginal + 1) + lVar4) != '\0') {
      uVar6 = (ushort)(skeleton->baseOriginal).lengths[lVar4];
      goto LAB_002ec707;
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  uVar6 = 0;
LAB_002ec707:
  pUVar5 = (UnicodeString *)0xffffffb9;
  if ((ushort)(uVar6 - 0x41) < 0x1a) {
    pUVar5 = (UnicodeString *)0xffffffbf;
  }
  else if (0x19 < (ushort)(uVar6 - 0x61)) {
    pPVar7 = (PtnElem *)0x0;
    goto joined_r0x002ec73d;
  }
  pUVar5 = (UnicodeString *)(ulong)((int)pUVar5 + (uint)uVar6);
  pPVar7 = this->boot[(long)pUVar5];
joined_r0x002ec73d:
  do {
    if (pPVar7 == (PtnElem *)0x0) {
      return (UnicodeString *)0x0;
    }
    pPVar3 = (pPVar7->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
    if (specifiedSkeletonPtr == (PtnSkeleton **)0x0) {
      auVar10[0] = -((skeleton->baseOriginal).chars[0] == (pPVar3->baseOriginal).chars[0]);
      auVar10[1] = -((skeleton->baseOriginal).chars[1] == (pPVar3->baseOriginal).chars[1]);
      auVar10[2] = -((skeleton->baseOriginal).chars[2] == (pPVar3->baseOriginal).chars[2]);
      auVar10[3] = -((skeleton->baseOriginal).chars[3] == (pPVar3->baseOriginal).chars[3]);
      auVar10[4] = -((skeleton->baseOriginal).chars[4] == (pPVar3->baseOriginal).chars[4]);
      auVar10[5] = -((skeleton->baseOriginal).chars[5] == (pPVar3->baseOriginal).chars[5]);
      auVar10[6] = -((skeleton->baseOriginal).chars[6] == (pPVar3->baseOriginal).chars[6]);
      auVar10[7] = -((skeleton->baseOriginal).chars[7] == (pPVar3->baseOriginal).chars[7]);
      auVar10[8] = -((skeleton->baseOriginal).chars[8] == (pPVar3->baseOriginal).chars[8]);
      auVar10[9] = -((skeleton->baseOriginal).chars[9] == (pPVar3->baseOriginal).chars[9]);
      auVar10[10] = -((skeleton->baseOriginal).chars[10] == (pPVar3->baseOriginal).chars[10]);
      auVar10[0xb] = -((skeleton->baseOriginal).chars[0xb] == (pPVar3->baseOriginal).chars[0xb]);
      auVar10[0xc] = -((skeleton->baseOriginal).chars[0xc] == (pPVar3->baseOriginal).chars[0xc]);
      auVar10[0xd] = -((skeleton->baseOriginal).chars[0xd] == (pPVar3->baseOriginal).chars[0xd]);
      auVar10[0xe] = -((skeleton->baseOriginal).chars[0xe] == (pPVar3->baseOriginal).chars[0xe]);
      auVar10[0xf] = -((skeleton->baseOriginal).chars[0xf] == (pPVar3->baseOriginal).chars[0xf]);
      if ((ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                  (ushort)(auVar10[0xf] >> 7) << 0xf) == 0xffff) {
        lVar4 = 0x78;
        goto LAB_002ec796;
      }
LAB_002ec78c:
      bVar8 = false;
    }
    else {
      auVar9[0] = -((skeleton->original).chars[0] == (pPVar3->original).chars[0]);
      auVar9[1] = -((skeleton->original).chars[1] == (pPVar3->original).chars[1]);
      auVar9[2] = -((skeleton->original).chars[2] == (pPVar3->original).chars[2]);
      auVar9[3] = -((skeleton->original).chars[3] == (pPVar3->original).chars[3]);
      auVar9[4] = -((skeleton->original).chars[4] == (pPVar3->original).chars[4]);
      auVar9[5] = -((skeleton->original).chars[5] == (pPVar3->original).chars[5]);
      auVar9[6] = -((skeleton->original).chars[6] == (pPVar3->original).chars[6]);
      auVar9[7] = -((skeleton->original).chars[7] == (pPVar3->original).chars[7]);
      auVar9[8] = -((skeleton->original).chars[8] == (pPVar3->original).chars[8]);
      auVar9[9] = -((skeleton->original).chars[9] == (pPVar3->original).chars[9]);
      auVar9[10] = -((skeleton->original).chars[10] == (pPVar3->original).chars[10]);
      auVar9[0xb] = -((skeleton->original).chars[0xb] == (pPVar3->original).chars[0xb]);
      auVar9[0xc] = -((skeleton->original).chars[0xc] == (pPVar3->original).chars[0xc]);
      auVar9[0xd] = -((skeleton->original).chars[0xd] == (pPVar3->original).chars[0xd]);
      auVar9[0xe] = -((skeleton->original).chars[0xe] == (pPVar3->original).chars[0xe]);
      auVar9[0xf] = -((skeleton->original).chars[0xf] == (pPVar3->original).chars[0xf]);
      if ((ushort)((ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1
                   | (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf
                  ) != 0xffff) goto LAB_002ec78c;
      lVar4 = 0x58;
LAB_002ec796:
      pcVar1 = (char *)((long)pPVar3->type + lVar4 + -8);
      pcVar2 = (char *)((long)skeleton->type + lVar4 + -8);
      auVar11[0] = -(*pcVar2 == *pcVar1);
      auVar11[1] = -(pcVar2[1] == pcVar1[1]);
      auVar11[2] = -(pcVar2[2] == pcVar1[2]);
      auVar11[3] = -(pcVar2[3] == pcVar1[3]);
      auVar11[4] = -(pcVar2[4] == pcVar1[4]);
      auVar11[5] = -(pcVar2[5] == pcVar1[5]);
      auVar11[6] = -(pcVar2[6] == pcVar1[6]);
      auVar11[7] = -(pcVar2[7] == pcVar1[7]);
      auVar11[8] = -(pcVar2[8] == pcVar1[8]);
      auVar11[9] = -(pcVar2[9] == pcVar1[9]);
      auVar11[10] = -(pcVar2[10] == pcVar1[10]);
      auVar11[0xb] = -(pcVar2[0xb] == pcVar1[0xb]);
      auVar11[0xc] = -(pcVar2[0xc] == pcVar1[0xc]);
      auVar11[0xd] = -(pcVar2[0xd] == pcVar1[0xd]);
      auVar11[0xe] = -(pcVar2[0xe] == pcVar1[0xe]);
      auVar11[0xf] = -(pcVar2[0xf] == pcVar1[0xf]);
      bVar8 = (ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                      (ushort)(auVar11[0xf] >> 7) << 0xf) == 0xffff;
    }
    if (bVar8) {
      if ((specifiedSkeletonPtr != (PtnSkeleton **)0x0) && (pPVar7->skeletonWasSpecified != '\0')) {
        *specifiedSkeletonPtr = (pPVar7->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>.ptr;
      }
      pUVar5 = &pPVar7->pattern;
    }
    else {
      pPVar7 = (pPVar7->next).super_LocalPointerBase<icu_63::PtnElem>.ptr;
    }
    if (bVar8) {
      return pUVar5;
    }
  } while( true );
}

Assistant:

const UnicodeString *
PatternMap::getPatternFromSkeleton(const PtnSkeleton& skeleton, const PtnSkeleton** specifiedSkeletonPtr) const { // key to search for
   PtnElem *curElem;

   if (specifiedSkeletonPtr) {
       *specifiedSkeletonPtr = nullptr;
   }

   // find boot entry
   UChar baseChar = skeleton.getFirstChar();
   if ((curElem=getHeader(baseChar))==nullptr) {
       return nullptr;  // no match
   }

   do  {
       UBool equal;
       if (specifiedSkeletonPtr != nullptr) { // called from DateTimePatternGenerator::getBestRaw or addPattern, use original
           equal = curElem->skeleton->original == skeleton.original;
       } else { // called from DateTimePatternGenerator::getRedundants, use baseOriginal
           equal = curElem->skeleton->baseOriginal == skeleton.baseOriginal;
       }
       if (equal) {
           if (specifiedSkeletonPtr && curElem->skeletonWasSpecified) {
               *specifiedSkeletonPtr = curElem->skeleton.getAlias();
           }
           return &(curElem->pattern);
       }
       curElem = curElem->next.getAlias();
   } while (curElem != nullptr);

   return nullptr;
}